

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hash.h
# Opt level: O1

size_t __thiscall std::hash<PPData::Peptide>::operator()(hash<PPData::Peptide> *this,Peptide *p)

{
  size_t sVar1;
  long *local_30;
  ulong local_28;
  long local_20 [2];
  
  local_30 = local_20;
  __cxx11::string::_M_construct<char_const*>
            ((string *)&local_30,p->sequence,p->sequence + p->sequence_length);
  sVar1 = std::_Hash_bytes(local_30,local_28,0xc70f6907);
  if (local_30 != local_20) {
    operator_delete(local_30,local_20[0] + 1);
  }
  return sVar1;
}

Assistant:

size_t operator()(const PPData::Peptide& p) const {
            return (hash<string>()(string(p.sequence, p.sequence_length)));
//            return CityHash32(p.sequence, p.sequence_length);
        }